

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCacheManager.cxx
# Opt level: O0

void cmCacheManager::OutputNewlineTruncationWarning
               (ostream *fout,string *key,string *value,cmMessenger *messenger)

{
  undefined8 this;
  long lVar1;
  cmAlphaNum local_148;
  cmAlphaNum local_118;
  undefined1 local_e8 [8];
  string comment;
  cmListFileBacktrace local_b8;
  cmAlphaNum local_a8;
  cmAlphaNum local_78;
  undefined1 local_48 [8];
  string message;
  cmMessenger *messenger_local;
  string *value_local;
  string *key_local;
  ostream *fout_local;
  
  message.field_2._8_8_ = messenger;
  lVar1 = std::__cxx11::string::find((char)value,10);
  if (lVar1 != -1) {
    if (message.field_2._8_8_ != 0) {
      cmAlphaNum::cmAlphaNum(&local_78,"Value of ");
      cmAlphaNum::cmAlphaNum(&local_a8,key);
      cmStrCat<char[33]>((string *)local_48,&local_78,&local_a8,
                         (char (*) [33])" contained a newline; truncating");
      this = message.field_2._8_8_;
      local_b8.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)0x0;
      local_b8.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      cmListFileBacktrace::cmListFileBacktrace(&local_b8);
      cmMessenger::IssueMessage((cmMessenger *)this,WARNING,(string *)local_48,&local_b8);
      cmListFileBacktrace::~cmListFileBacktrace(&local_b8);
      std::__cxx11::string::~string((string *)local_48);
    }
    cmAlphaNum::cmAlphaNum(&local_118,"WARNING: Value of ");
    cmAlphaNum::cmAlphaNum(&local_148,key);
    cmStrCat<char[56]>((string *)local_e8,&local_118,&local_148,
                       (char (*) [56])" contained a newline and was truncated. Original value:");
    OutputWarningComment(fout,(string *)local_e8,true);
    OutputWarningComment(fout,value,false);
    std::__cxx11::string::~string((string *)local_e8);
  }
  return;
}

Assistant:

void cmCacheManager::OutputNewlineTruncationWarning(std::ostream& fout,
                                                    std::string const& key,
                                                    std::string const& value,
                                                    cmMessenger* messenger)
{
  if (value.find('\n') != std::string::npos) {
    if (messenger) {
      std::string message =
        cmStrCat("Value of ", key, " contained a newline; truncating");
      messenger->IssueMessage(MessageType::WARNING, message);
    }

    std::string comment =
      cmStrCat("WARNING: Value of ", key,
               " contained a newline and was truncated. Original value:");

    OutputWarningComment(fout, comment, true);
    OutputWarningComment(fout, value, false);
  }
}